

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

ShaderResources * __thiscall
spirv_cross::Compiler::get_shader_resources
          (ShaderResources *__return_storage_ptr__,Compiler *this,
          unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
          *active_variables)

{
  ParsedIR *this_00;
  uint id;
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  StorageClass SVar5;
  SPIRVariable *var;
  SPIRType *pSVar6;
  const_iterator cVar7;
  string *psVar8;
  undefined1 fallback_prefer_instance_name;
  int iVar9;
  uint32_t uVar10;
  ShaderResources *this_01;
  long lVar11;
  undefined1 local_d8 [16];
  string local_c8;
  uint local_a4;
  ShaderResources *local_a0;
  ShaderResources *local_98;
  ShaderResources *local_90;
  ShaderResources *local_88;
  LoopLock local_80;
  ShaderResources *local_78;
  ShaderResources *local_70;
  ShaderResources *local_68;
  ShaderResources *local_60;
  ShaderResources *local_58;
  ShaderResources *local_50;
  ShaderResources *local_48;
  ShaderResources *local_40;
  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_38;
  
  ShaderResources::ShaderResources(__return_storage_ptr__);
  local_a0 = __return_storage_ptr__;
  bVar3 = reflection_ssbo_instance_name_is_significant(this);
  this_00 = &this->ir;
  local_38 = &active_variables->_M_h;
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar1 = (this->ir).ids_for_type[2].super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
           .ptr;
  sVar2 = (this->ir).ids_for_type[2].super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
          buffer_size;
  local_58 = (ShaderResources *)&__return_storage_ptr__->storage_images;
  local_48 = (ShaderResources *)&__return_storage_ptr__->push_constant_buffers;
  local_98 = (ShaderResources *)&__return_storage_ptr__->storage_buffers;
  local_78 = (ShaderResources *)&__return_storage_ptr__->acceleration_structures;
  local_70 = (ShaderResources *)&__return_storage_ptr__->atomic_counters;
  local_68 = (ShaderResources *)&__return_storage_ptr__->sampled_images;
  local_60 = (ShaderResources *)&__return_storage_ptr__->separate_samplers;
  local_50 = (ShaderResources *)&__return_storage_ptr__->separate_images;
  local_90 = (ShaderResources *)&__return_storage_ptr__->stage_outputs;
  local_40 = (ShaderResources *)&__return_storage_ptr__->subpass_inputs;
  local_88 = (ShaderResources *)&__return_storage_ptr__->stage_inputs;
  lVar11 = 0;
  do {
    if (sVar2 << 2 == lVar11) {
      ParsedIR::LoopLock::~LoopLock(&local_80);
      return local_a0;
    }
    id = *(uint *)((long)&pTVar1->id + lVar11);
    if ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr[id].type == TypeVariable) {
      var = ParsedIR::get<spirv_cross::SPIRVariable>(this_00,id);
      pSVar6 = get<spirv_cross::SPIRType>(this,*(uint32_t *)&(var->super_IVariant).field_0xc);
      if (((var->storage != StorageClassFunction) && (pSVar6->pointer == true)) &&
         (bVar4 = is_builtin_variable(this,var), !bVar4)) {
        if (local_38 !=
            (_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             *)0x0) {
          local_d8._0_4_ = (var->super_IVariant).self.id;
          cVar7 = ::std::
                  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(local_38,(key_type *)local_d8);
          if (cVar7.super__Node_iterator_base<spirv_cross::TypedID<(spirv_cross::Types)2>,_true>.
              _M_cur == (__node_type *)0x0) goto LAB_002e6487;
        }
        SVar5 = var->storage;
        if (SVar5 == StorageClassInput) {
          bVar4 = interface_variable_exists_in_entry_point(this,(var->super_IVariant).self.id);
          if (!bVar4) {
            SVar5 = var->storage;
            goto LAB_002e60ed;
          }
          bVar4 = ParsedIR::has_decoration
                            (this_00,(ID)(pSVar6->super_IVariant).self.id,DecorationBlock);
          if (bVar4) {
            local_d8._0_4_ = (var->super_IVariant).self;
            local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
            local_d8._8_4_ = (pSVar6->super_IVariant).self.id;
            get_remapped_declared_block_name_abi_cxx11_
                      ((string *)(local_d8 + 0x10),this,local_d8._0_4_,false);
            this_01 = local_88;
          }
          else {
            local_d8._0_4_ = (var->super_IVariant).self;
            local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
            local_d8._8_4_ = (pSVar6->super_IVariant).self.id;
            psVar8 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_d8._0_4_);
            ::std::__cxx11::string::string((string *)(local_d8 + 0x10),(string *)psVar8);
            this_01 = local_88;
          }
        }
        else {
LAB_002e60ed:
          if ((SVar5 == StorageClassUniformConstant) && ((pSVar6->image).dim == DimSubpassData)) {
            local_d8._0_4_ = (var->super_IVariant).self;
            local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
            local_d8._8_4_ = (pSVar6->super_IVariant).self.id;
            psVar8 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_d8._0_4_);
            ::std::__cxx11::string::string((string *)(local_d8 + 0x10),(string *)psVar8);
            this_01 = local_40;
          }
          else if ((SVar5 == StorageClassOutput) &&
                  (bVar4 = interface_variable_exists_in_entry_point
                                     (this,(var->super_IVariant).self.id), bVar4)) {
            bVar4 = ParsedIR::has_decoration
                              (this_00,(ID)(pSVar6->super_IVariant).self.id,DecorationBlock);
            if (bVar4) {
              local_d8._0_4_ = (var->super_IVariant).self;
              local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
              local_d8._8_4_ = (pSVar6->super_IVariant).self.id;
              get_remapped_declared_block_name_abi_cxx11_
                        ((string *)(local_d8 + 0x10),this,local_d8._0_4_,false);
              this_01 = local_90;
            }
            else {
              local_d8._0_4_ = (var->super_IVariant).self;
              local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
              local_d8._8_4_ = (pSVar6->super_IVariant).self.id;
              psVar8 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_d8._0_4_);
              ::std::__cxx11::string::string((string *)(local_d8 + 0x10),(string *)psVar8);
              this_01 = local_90;
            }
          }
          else {
            SVar5 = pSVar6->storage;
            fallback_prefer_instance_name = bVar3;
            if (SVar5 == StorageClassUniform) {
              local_a4 = (uint)bVar3;
              bVar4 = ParsedIR::has_decoration
                                (this_00,(ID)(pSVar6->super_IVariant).self.id,DecorationBlock);
              if (bVar4) {
                local_d8._0_4_ = (var->super_IVariant).self;
                local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                local_d8._8_4_ = (pSVar6->super_IVariant).self.id;
                get_remapped_declared_block_name_abi_cxx11_
                          ((string *)(local_d8 + 0x10),this,local_d8._0_4_,false);
                this_01 = local_a0;
                goto LAB_002e6473;
              }
              SVar5 = pSVar6->storage;
              fallback_prefer_instance_name = (undefined1)local_a4;
              if (SVar5 == StorageClassUniform) {
                bVar4 = ParsedIR::has_decoration
                                  (this_00,(ID)(pSVar6->super_IVariant).self.id,
                                   DecorationBufferBlock);
                fallback_prefer_instance_name = (undefined1)local_a4;
                if (bVar4) {
                  local_d8._0_4_ = (var->super_IVariant).self;
                  local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                  local_d8._8_4_ = (pSVar6->super_IVariant).self.id;
                  get_remapped_declared_block_name_abi_cxx11_
                            ((string *)(local_d8 + 0x10),this,local_d8._0_4_,
                             (bool)fallback_prefer_instance_name);
                  this_01 = local_98;
                  goto LAB_002e6473;
                }
                SVar5 = pSVar6->storage;
              }
            }
            if (SVar5 == StorageClassUniformConstant) {
              iVar9 = *(int *)&(pSVar6->super_IVariant).field_0xc;
              uVar10 = (pSVar6->image).sampled;
              if (uVar10 == 2 && iVar9 == 0x10) {
                local_d8._0_4_ = (var->super_IVariant).self;
                local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                local_d8._8_4_ = (pSVar6->super_IVariant).self.id;
                psVar8 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_d8._0_4_);
                ::std::__cxx11::string::string((string *)(local_d8 + 0x10),(string *)psVar8);
                this_01 = local_58;
              }
              else {
LAB_002e6352:
                if (((SVar5 == StorageClassUniformConstant) && (iVar9 == 0x10)) && (uVar10 == 1)) {
                  local_d8._0_4_ = (var->super_IVariant).self;
                  local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                  local_d8._8_4_ = (pSVar6->super_IVariant).self.id;
                  psVar8 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_d8._0_4_);
                  ::std::__cxx11::string::string((string *)(local_d8 + 0x10),(string *)psVar8);
                  this_01 = local_50;
                }
                else if (iVar9 == 0x12 && SVar5 == StorageClassUniformConstant) {
                  local_d8._0_4_ = (var->super_IVariant).self;
                  local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                  local_d8._8_4_ = (pSVar6->super_IVariant).self.id;
                  psVar8 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_d8._0_4_);
                  ::std::__cxx11::string::string((string *)(local_d8 + 0x10),(string *)psVar8);
                  this_01 = local_60;
                }
                else {
                  if (iVar9 != 0x11 || SVar5 != StorageClassUniformConstant) {
                    if (SVar5 == StorageClassUniformConstant) {
                      if (iVar9 == 0x13) {
                        local_d8._0_4_ = (var->super_IVariant).self;
                        local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                        local_d8._8_4_ = (pSVar6->super_IVariant).self.id;
                        psVar8 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_d8._0_4_);
                        ::std::__cxx11::string::string((string *)(local_d8 + 0x10),(string *)psVar8)
                        ;
                        this_01 = local_78;
                        goto LAB_002e6473;
                      }
                    }
                    else if (SVar5 == StorageClassAtomicCounter) {
                      local_d8._0_4_ = (var->super_IVariant).self;
                      local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                      local_d8._8_4_ = (pSVar6->super_IVariant).self.id;
                      psVar8 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_d8._0_4_);
                      ::std::__cxx11::string::string((string *)(local_d8 + 0x10),(string *)psVar8);
                      this_01 = local_70;
                      goto LAB_002e6473;
                    }
                    goto LAB_002e6487;
                  }
                  local_d8._0_4_ = (var->super_IVariant).self;
                  local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                  local_d8._8_4_ = (pSVar6->super_IVariant).self.id;
                  psVar8 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_d8._0_4_);
                  ::std::__cxx11::string::string((string *)(local_d8 + 0x10),(string *)psVar8);
                  this_01 = local_68;
                }
              }
            }
            else if (SVar5 == StorageClassPushConstant) {
              local_d8._0_4_ = (var->super_IVariant).self;
              local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
              local_d8._8_4_ = (pSVar6->super_IVariant).self.id;
              psVar8 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_d8._0_4_);
              ::std::__cxx11::string::string((string *)(local_d8 + 0x10),(string *)psVar8);
              this_01 = local_48;
            }
            else {
              if (SVar5 != StorageClassStorageBuffer) {
                iVar9 = *(int *)&(pSVar6->super_IVariant).field_0xc;
                uVar10 = (pSVar6->image).sampled;
                goto LAB_002e6352;
              }
              local_d8._0_4_ = (var->super_IVariant).self;
              local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
              local_d8._8_4_ = (pSVar6->super_IVariant).self.id;
              get_remapped_declared_block_name_abi_cxx11_
                        ((string *)(local_d8 + 0x10),this,local_d8._0_4_,
                         (bool)fallback_prefer_instance_name);
              this_01 = local_98;
            }
          }
        }
LAB_002e6473:
        SmallVector<spirv_cross::Resource,_8UL>::push_back
                  (&this_01->uniform_buffers,(Resource *)local_d8);
        ::std::__cxx11::string::~string((string *)(local_d8 + 0x10));
      }
    }
LAB_002e6487:
    lVar11 = lVar11 + 4;
  } while( true );
}

Assistant:

ShaderResources Compiler::get_shader_resources(const unordered_set<VariableID> *active_variables) const
{
	ShaderResources res;

	bool ssbo_instance_name = reflection_ssbo_instance_name_is_significant();

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		// It is possible for uniform storage classes to be passed as function parameters, so detect
		// that. To detect function parameters, check of StorageClass of variable is function scope.
		if (var.storage == StorageClassFunction || !type.pointer || is_builtin_variable(var))
			return;

		if (active_variables && active_variables->find(var.self) == end(*active_variables))
			return;

		// Input
		if (var.storage == StorageClassInput && interface_variable_exists_in_entry_point(var.self))
		{
			if (has_decoration(type.self, DecorationBlock))
			{
				res.stage_inputs.push_back(
				    { var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, false) });
			}
			else
				res.stage_inputs.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Subpass inputs
		else if (var.storage == StorageClassUniformConstant && type.image.dim == DimSubpassData)
		{
			res.subpass_inputs.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Outputs
		else if (var.storage == StorageClassOutput && interface_variable_exists_in_entry_point(var.self))
		{
			if (has_decoration(type.self, DecorationBlock))
			{
				res.stage_outputs.push_back(
				    { var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, false) });
			}
			else
				res.stage_outputs.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// UBOs
		else if (type.storage == StorageClassUniform && has_decoration(type.self, DecorationBlock))
		{
			res.uniform_buffers.push_back(
			    { var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, false) });
		}
		// Old way to declare SSBOs.
		else if (type.storage == StorageClassUniform && has_decoration(type.self, DecorationBufferBlock))
		{
			res.storage_buffers.push_back(
			    { var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, ssbo_instance_name) });
		}
		// Modern way to declare SSBOs.
		else if (type.storage == StorageClassStorageBuffer)
		{
			res.storage_buffers.push_back(
			    { var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, ssbo_instance_name) });
		}
		// Push constant blocks
		else if (type.storage == StorageClassPushConstant)
		{
			// There can only be one push constant block, but keep the vector in case this restriction is lifted
			// in the future.
			res.push_constant_buffers.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Images
		else if (type.storage == StorageClassUniformConstant && type.basetype == SPIRType::Image &&
		         type.image.sampled == 2)
		{
			res.storage_images.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Separate images
		else if (type.storage == StorageClassUniformConstant && type.basetype == SPIRType::Image &&
		         type.image.sampled == 1)
		{
			res.separate_images.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Separate samplers
		else if (type.storage == StorageClassUniformConstant && type.basetype == SPIRType::Sampler)
		{
			res.separate_samplers.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Textures
		else if (type.storage == StorageClassUniformConstant && type.basetype == SPIRType::SampledImage)
		{
			res.sampled_images.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Atomic counters
		else if (type.storage == StorageClassAtomicCounter)
		{
			res.atomic_counters.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Acceleration structures
		else if (type.storage == StorageClassUniformConstant && type.basetype == SPIRType::AccelerationStructure)
		{
			res.acceleration_structures.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
	});

	return res;
}